

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_usdf.cpp
# Opt level: O3

bool __thiscall
USDFParser::ParseCostRequireExclude(USDFParser *this,FStrifeDialogueReply *response,FName *type)

{
  int *piVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  PClassActor *p;
  PClassInventory *pPVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  FName key;
  int local_3c;
  FName *local_38;
  
  local_38 = type;
  bVar3 = FScanner::CheckToken((FScanner *)this,0x7d);
  iVar4 = -1;
  pPVar5 = (PClassInventory *)0x0;
  if (!bVar3) {
    do {
      UDMFParserBase::ParseKey((UDMFParserBase *)&stack0xffffffffffffffc4,SUB81(this,0),(bool *)0x0)
      ;
      if (local_3c == 0x1de) {
        iVar4 = UDMFParserBase::CheckInt
                          (&this->super_UDMFParserBase,FName::NameData.NameArray[0x1de].Text);
      }
      else if (local_3c == 0x29) {
        p = CheckActorType(this,FName::NameData.NameArray[0x29].Text);
        pPVar5 = dyn_cast<PClassInventory>((DObject *)p);
      }
      bVar3 = FScanner::CheckToken((FScanner *)this,0x7d);
    } while (!bVar3);
  }
  iVar2 = local_38->Index;
  if (iVar2 == 0x1e7) {
    lVar8 = 0x34;
    lVar7 = 0x28;
  }
  else if (iVar2 == 0x1f2) {
    lVar8 = 0x54;
    lVar7 = 0x48;
  }
  else {
    if (iVar2 != 0x1f1) {
      return true;
    }
    lVar8 = 0x44;
    lVar7 = 0x38;
  }
  TArray<FStrifeDialogueItemCheck,_FStrifeDialogueItemCheck>::Grow
            ((TArray<FStrifeDialogueItemCheck,_FStrifeDialogueItemCheck> *)
             ((long)response->Args + lVar7 + -0x14),1);
  lVar7 = *(long *)((long)response->Args + lVar7 + -0x14);
  lVar6 = (ulong)*(uint *)((long)response->Args + lVar8 + -0x14) * 0x10;
  *(PClassInventory **)(lVar7 + lVar6) = pPVar5;
  *(int *)(lVar7 + 8 + lVar6) = iVar4;
  piVar1 = (int *)((long)response->Args + lVar8 + -0x14);
  *piVar1 = *piVar1 + 1;
  return true;
}

Assistant:

bool ParseCostRequireExclude(FStrifeDialogueReply *response, FName type)
	{
		FStrifeDialogueItemCheck check;
		check.Item = NULL;
		check.Amount = -1;

		while (!sc.CheckToken('}'))
		{
			FName key = ParseKey();
			switch(key)
			{
			case NAME_Item:
				check.Item = dyn_cast<PClassInventory>(CheckActorType(key));
				break;

			case NAME_Amount:
				check.Amount = CheckInt(key);
				break;
			}
		}

		switch (type)
		{
		case NAME_Cost:		response->ItemCheck.Push(check);	break;
		case NAME_Require:	response->ItemCheckRequire.Push(check); break;
		case NAME_Exclude:	response->ItemCheckExclude.Push(check); break;
		}
		return true;
	}